

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O3

void __thiscall
duckdb::BinaryAggregateHeap<long,_float,_duckdb::LessThan>::Insert
          (BinaryAggregateHeap<long,_float,_duckdb::LessThan> *this,ArenaAllocator *allocator,
          long *key,float *value)

{
  float fVar1;
  long lVar2;
  long lVar3;
  ulong __holeIndex;
  pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<float>_> *__first;
  pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<float>_> __value;
  pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<float>_> __value_00;
  _Iter_comp_val<bool_(*)(const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<float>_>_&,_const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<float>_>_&)>
  __cmp;
  _Iter_comp_val<bool_(*)(const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<float>_>_&,_const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<float>_>_&)>
  local_20;
  
  __first = this->heap;
  __holeIndex = this->size;
  lVar3 = *key;
  if (__holeIndex < this->capacity) {
    __first[__holeIndex].first.value = lVar3;
    __first[__holeIndex].second.value = *value;
    this->size = __holeIndex + 1;
    lVar3 = __first[__holeIndex].first.value;
    fVar1 = __first[__holeIndex].second.value;
  }
  else {
    lVar2 = (__first->first).value;
    if (lVar2 <= lVar3) {
      return;
    }
    if (1 < (long)__holeIndex) {
      lVar3 = __first[__holeIndex - 1].first.value;
      fVar1 = __first[__holeIndex - 1].second.value;
      __first[__holeIndex - 1].first.value = lVar2;
      __first[__holeIndex - 1].second.value = (__first->second).value;
      __value.second.value = fVar1;
      __value.first.value = lVar3;
      __value._12_4_ = 0;
      std::
      __adjust_heap<std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<float>>*,long,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<float>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<float>>const&,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<float>>const&)>>
                (__first,0,(long)(__holeIndex * 0x10 + -0x10) >> 4,__value,
                 (_Iter_comp_iter<bool_(*)(const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<float>_>_&,_const_std::pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<float>_>_&)>
                  )Compare);
      __first = this->heap;
      __holeIndex = this->size;
      lVar3 = *key;
    }
    __first[__holeIndex - 1].first.value = lVar3;
    fVar1 = *value;
    __first[__holeIndex - 1].second.value = fVar1;
    __holeIndex = ((long)(__holeIndex * 0x10) >> 4) - 1;
  }
  local_20._M_comp = Compare;
  __value_00.second.value = fVar1;
  __value_00.first.value = lVar3;
  __value_00._12_4_ = 0;
  std::
  __push_heap<std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<float>>*,long,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<float>>,__gnu_cxx::__ops::_Iter_comp_val<bool(*)(std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<float>>const&,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<float>>const&)>>
            (__first,__holeIndex,0,__value_00,&local_20);
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const K &key, const V &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size].first.Assign(allocator, key);
			heap[size].second.Assign(allocator, value);
			size++;
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (K_COMPARATOR::Operation(key, heap[0].first.value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].first.Assign(allocator, key);
			heap[size - 1].second.Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}